

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_sstream.c
# Opt level: O2

double HTS_set_default_duration(size_t *duration,double *mean,double *vari,size_t size)

{
  double *pdVar1;
  double dVar2;
  
  for (pdVar1 = (double *)0x0; vari != pdVar1; pdVar1 = (double *)((long)pdVar1 + 1)) {
    dVar2 = 1.0;
    if (1.0 <= mean[(long)pdVar1] + 0.5) {
      dVar2 = mean[(long)pdVar1] + 0.5;
    }
    duration[(long)pdVar1] =
         (long)(dVar2 - 9.223372036854776e+18) & (long)dVar2 >> 0x3f | (long)dVar2;
  }
  return 0.5;
}

Assistant:

static double HTS_set_default_duration(size_t * duration, double *mean, double *vari, size_t size)
{
   size_t i;
   double temp;
   size_t sum = 0;

   for (i = 0; i < size; i++) {
      temp = mean[i] + 0.5;
      if (temp < 1.0)
         duration[i] = 1;
      else
         duration[i] = (size_t) temp;
      sum += duration[i];
   }

   return (double) sum;
}